

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CsvHelper.cpp
# Opt level: O2

int CsvHelper::read_number(int *number,size_t start,char *buffer,size_t buffer_max)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  char text [64];
  
  sVar8 = start;
  if (start < buffer_max) {
    sVar8 = buffer_max;
  }
  for (; start < buffer_max; start = start + 1) {
    cVar1 = buffer[start];
    if ((cVar1 != '\t') && (cVar1 != ' ')) {
      sVar8 = start;
      if (cVar1 == '\"') {
        uVar4 = 0;
        bVar2 = false;
        uVar6 = 0xffffffff;
        goto LAB_00171bf5;
      }
      break;
    }
  }
  uVar4 = 0;
  for (; ((sVar8 < buffer_max && (cVar1 = buffer[sVar8], cVar1 != '\0')) && (cVar1 != ','));
      sVar8 = sVar8 + 1) {
    if ((int)uVar4 < 0x3f) {
      text[(int)uVar4] = cVar1;
      uVar4 = uVar4 + 1;
    }
  }
  goto LAB_00171c90;
  while( true ) {
    bVar3 = uVar4 - uVar6 != 3 && bVar2;
    start = uVar7 + 1;
    bVar2 = true;
    uVar6 = uVar4;
    if (bVar3) break;
LAB_00171bf5:
    uVar7 = start;
    start = uVar7 + 1;
    sVar8 = buffer_max;
    if (buffer_max <= start) goto LAB_00171c90;
    cVar1 = buffer[uVar7 + 1];
    if (cVar1 == '\0') goto LAB_00171c58;
    if (cVar1 != ',') {
      if (cVar1 == '\"') {
        sVar8 = uVar7 + 2;
        goto LAB_00171c90;
      }
      if (uVar4 < 0x3f) {
        text[uVar4] = cVar1;
        uVar4 = uVar4 + 1;
      }
      goto LAB_00171bf5;
    }
  }
  text[uVar4] = ',';
  uVar4 = uVar4 + 1;
LAB_00171c58:
  sVar8 = uVar7 + 1;
LAB_00171c90:
  text[(int)uVar4] = '\0';
  iVar5 = atoi(text);
  *number = iVar5;
  sVar9 = buffer_max;
  if (buffer_max < sVar8) {
    sVar9 = sVar8;
  }
  do {
    if (buffer_max <= sVar8) {
LAB_00171cd2:
      return (int)sVar9;
    }
    cVar1 = buffer[sVar8];
    if ((cVar1 != '\t') && (cVar1 != ' ')) {
      sVar9 = sVar8;
      if (cVar1 == ',') {
        sVar9 = sVar8 + 1;
      }
      goto LAB_00171cd2;
    }
    sVar8 = sVar8 + 1;
  } while( true );
}

Assistant:

int CsvHelper::read_number(int * number, size_t start, char const * buffer, size_t buffer_max)
{
    int x = 0;
    char text[64];
    int text_max = sizeof(text);
    int has_comma = 0;
    int last_comma_index = -1;


    /* Skip blanks */
    while (start < buffer_max && (buffer[start] == ' ' || buffer[start] == '\t'))
    {
        start++;
    }

    /* If quoted, remove the quotes */
    if (start < buffer_max && buffer[start] == '"')
    {
        start++;
        while (start < buffer_max && buffer[start] != 0)
        {
            if (buffer[start] == '"')
            {
                /* Skip the quote and break. */
                start++;
                break;
            }
            else if (buffer[start] == ',')
            {
                /* Skip the comma unless there is a syntax error. */
                if (has_comma != 0)
                {
                    if ((x - last_comma_index) != 3)
                    {
                        text[x++] = ',';
                        break;
                    }
                }

                has_comma = 1;
                last_comma_index = x;
                start++;
            }
            else
            {
                if (x < (text_max - 1))
                {
                    text[x] = buffer[start];
                    x++;
                }
                start++;
            }
        }
    }
    else
    {
        while (start < buffer_max && buffer[start] != 0 && buffer[start] != ',')
        {
            if (x < (text_max - 1))
            {
                text[x] = buffer[start];
                x++;
            }
            start++;
        }
    }
    text[x] = 0;

    *number = atoi(text);

    /* Skip comma */
    while (start < buffer_max)
    {
        if (buffer[start] == ',')
        {
            start++;
            break;
        }
        else if (buffer[start] == ' ' || buffer[start] == '\t')
        {
            start++;
        }
        else
        {
            break;
        }
    }

    return (int)start;
}